

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

void finish_pass_huff(j_compress_ptr cinfo)

{
  boolean bVar1;
  undefined1 local_50 [8];
  working_state state;
  huff_entropy_ptr_conflict entropy;
  j_compress_ptr cinfo_local;
  
  state.cinfo = (j_compress_ptr)cinfo->entropy;
  if (cinfo->progressive_mode == 0) {
    local_50 = (undefined1  [8])cinfo->dest->next_output_byte;
    state.next_output_byte = (JOCTET *)cinfo->dest->free_in_buffer;
    state.free_in_buffer = ((savable_state_conflict *)&(state.cinfo)->client_data)->put_buffer;
    state.cur.put_buffer = *(INT32 *)&(state.cinfo)->is_decompressor;
    state.cur._8_8_ = (state.cinfo)->dest;
    state.cur.last_dc_val[1] = (state.cinfo)->image_width;
    state.cur.last_dc_val[2] = (state.cinfo)->image_height;
    state.cur._24_8_ = cinfo;
    bVar1 = flush_bits_s((working_state *)local_50);
    if (bVar1 == 0) {
      cinfo->err->msg_code = 0x19;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    cinfo->dest->next_output_byte = (JOCTET *)local_50;
    cinfo->dest->free_in_buffer = (size_t)state.next_output_byte;
    (state.cinfo)->client_data = (void *)state.free_in_buffer;
    (state.cinfo)->is_decompressor = (undefined4)state.cur.put_buffer;
    (state.cinfo)->global_state = state.cur.put_buffer._4_4_;
    (state.cinfo)->dest = (jpeg_destination_mgr *)state.cur._8_8_;
    (state.cinfo)->image_width = state.cur.last_dc_val[1];
    (state.cinfo)->image_height = state.cur.last_dc_val[2];
  }
  else {
    (state.cinfo)->ac_huff_tbl_ptrs[1] = (JHUFF_TBL *)cinfo->dest->next_output_byte;
    (state.cinfo)->ac_huff_tbl_ptrs[2] = (JHUFF_TBL *)cinfo->dest->free_in_buffer;
    emit_eobrun((huff_entropy_ptr_conflict)state.cinfo);
    flush_bits_e((huff_entropy_ptr_conflict)state.cinfo);
    cinfo->dest->next_output_byte = (state.cinfo)->ac_huff_tbl_ptrs[1]->bits;
    cinfo->dest->free_in_buffer = (size_t)(state.cinfo)->ac_huff_tbl_ptrs[2];
  }
  return;
}

Assistant:

METHODDEF(void)
finish_pass_huff (j_compress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  working_state state;

  if (cinfo->progressive_mode) {
    entropy->next_output_byte = cinfo->dest->next_output_byte;
    entropy->free_in_buffer = cinfo->dest->free_in_buffer;

    /* Flush out any buffered data */
    emit_eobrun(entropy);
    flush_bits_e(entropy);

    cinfo->dest->next_output_byte = entropy->next_output_byte;
    cinfo->dest->free_in_buffer = entropy->free_in_buffer;
  } else {
    /* Load up working state ... flush_bits needs it */
    state.next_output_byte = cinfo->dest->next_output_byte;
    state.free_in_buffer = cinfo->dest->free_in_buffer;
    ASSIGN_STATE(state.cur, entropy->saved);
    state.cinfo = cinfo;

    /* Flush out the last data */
    if (! flush_bits_s(&state))
      ERREXIT(cinfo, JERR_CANT_SUSPEND);

    /* Update state */
    cinfo->dest->next_output_byte = state.next_output_byte;
    cinfo->dest->free_in_buffer = state.free_in_buffer;
    ASSIGN_STATE(entropy->saved, state.cur);
  }
}